

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_storage.cpp
# Opt level: O0

void __thiscall
RequestSpansRegions_MinRegionSize_Test::~RequestSpansRegions_MinRegionSize_Test
          (RequestSpansRegions_MinRegionSize_Test *this)

{
  RequestSpansRegions_MinRegionSize_Test *this_local;
  
  ~RequestSpansRegions_MinRegionSize_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (RequestSpansRegions, MinRegionSize) {
    auto const region_size = pstore::address{pstore::storage::min_region_size};
    auto file = this->build_new_store (pstore::storage::min_region_size + region_size.absolute ());

    {
        pstore::database db1{file};
        db1.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
        this->allocate (db1, region_size.absolute () + 1U);
        pstore::storage const & st1 = db1.storage ();

        ASSERT_EQ (st1.regions ().size (), 2U)
            << "The allocate() should should require a second region to be created.";

        pstore::storage::region_container const & regions1 = st1.regions ();
        EXPECT_EQ (regions1[0]->size (), pstore::storage::min_region_size);
        EXPECT_EQ (regions1[0]->offset (), 0U);
        EXPECT_EQ (regions1[1]->size (), pstore::storage::min_region_size);
        EXPECT_EQ (regions1[1]->offset (), pstore::storage::min_region_size);

        EXPECT_FALSE (st1.request_spans_regions (pstore::address::null (), std::size_t{0}));
        EXPECT_FALSE (
            st1.request_spans_regions (pstore::address::null (), pstore::address::segment_size));
        EXPECT_FALSE (st1.request_spans_regions (region_size - 1U, std::size_t{1}));
        EXPECT_FALSE (st1.request_spans_regions (region_size, std::size_t{1}));
        EXPECT_TRUE (st1.request_spans_regions (region_size - 1U, std::size_t{2}));
    }
    {
        pstore::database db2{file};
        db2.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

        pstore::storage const & st2 = db2.storage ();
        ASSERT_EQ (st2.regions ().size (), 1U)
            << "On open, we create regions that are as large as possible (up to full_region_size).";

        pstore::storage::region_container const & regions2 = st2.regions ();
        EXPECT_EQ (regions2[0]->size (), pstore::storage::min_region_size * 2);
        EXPECT_EQ (regions2[0]->offset (), 0U);

        EXPECT_FALSE (
            st2.request_spans_regions (pstore::address::null (), pstore::address::segment_size));
        EXPECT_FALSE (st2.request_spans_regions (region_size - 1U, std::size_t{1}));
        EXPECT_FALSE (st2.request_spans_regions (region_size, std::size_t{1}));
        EXPECT_FALSE (st2.request_spans_regions (region_size - 1U, std::size_t{2}));
        EXPECT_FALSE (
            st2.request_spans_regions (pstore::address::null (), region_size.absolute () + 1U));
    }
}